

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_xyz_vol(REF_DBL **xyzs,REF_DBL *volume)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  pdVar1 = *xyzs;
  pdVar2 = xyzs[1];
  pdVar3 = xyzs[2];
  pdVar4 = xyzs[3];
  dVar6 = pdVar2[2] - pdVar4[2];
  dVar5 = *pdVar4;
  dVar7 = pdVar2[1] - pdVar4[1];
  *volume = (((dVar7 * (pdVar3[2] - pdVar4[2]) - dVar6 * (pdVar3[1] - pdVar4[1])) *
              (*pdVar1 - dVar5) -
             ((pdVar3[2] - pdVar4[2]) * (*pdVar2 - dVar5) + -(*pdVar3 - dVar5) * dVar6) *
             (pdVar1[1] - pdVar4[1])) +
            ((*pdVar2 - dVar5) * (pdVar3[1] - pdVar4[1]) - dVar7 * (*pdVar3 - dVar5)) *
            (pdVar1[2] - pdVar4[2])) / -6.0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_xyz_vol(REF_DBL *xyzs[4], REF_DBL *volume) {
  REF_DBL *a, *b, *c, *d;
  REF_DBL m11, m12, m13;
  REF_DBL det;

  a = xyzs[0];
  b = xyzs[1];
  c = xyzs[2];
  d = xyzs[3];

  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  det = (m11 - m12 + m13);

  *volume = -det / 6.0;

  return REF_SUCCESS;
}